

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O3

void __thiscall
iqnet::Reactor<iqnet::Null_lock>::unregister_handler
          (Reactor<iqnet::Null_lock> *this,Event_handler *eh)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  int iVar3;
  _Base_ptr p_Var4;
  iterator __position;
  _List_node_base *p_Var5;
  
  iVar3 = (*eh->_vptr_Event_handler[9])(eh);
  p_Var4 = (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->handlers)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var1->_M_header;
    do {
      if (iVar3 <= (int)p_Var4[1]._M_color) {
        __position._M_node = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar3];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
       ((int)__position._M_node[1]._M_color <= iVar3)) {
      std::
      _Rb_tree<int,std::pair<int_const,iqnet::Event_handler*>,std::_Select1st<std::pair<int_const,iqnet::Event_handler*>>,std::less<int>,std::allocator<std::pair<int_const,iqnet::Event_handler*>>>
      ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,iqnet::Event_handler*>,std::_Select1st<std::pair<int_const,iqnet::Event_handler*>>,std::less<int>,std::allocator<std::pair<int_const,iqnet::Event_handler*>>>
                          *)&this->handlers,__position);
      p_Var5 = (this->handlers_states).
               super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      iVar3 = (*eh->_vptr_Event_handler[9])(eh);
      for (; (p_Var5 != (_List_node_base *)&this->handlers_states &&
             (*(int *)&p_Var5[1]._M_next != iVar3)); p_Var5 = p_Var5->_M_next) {
      }
      psVar2 = &(this->handlers_states).
                super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5,0x18);
      iVar3 = (*eh->_vptr_Event_handler[2])(eh);
      if ((char)iVar3 != '\0') {
        this->num_stoppers = this->num_stoppers - 1;
      }
    }
  }
  return;
}

Assistant:

void Reactor<Lock>::unregister_handler( Event_handler* eh )
{
  scoped_lock lk(lock);
  h_iterator i = handlers.find(eh->get_handler());

  if( i != handlers.end() )
  {
    handlers.erase(i);
    handlers_states.erase(find_handler_state(eh));

    if (eh->is_stopper())
      num_stoppers--;
  }
}